

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNearInitAll(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  Fts5ExprNearset *pFVar1;
  Fts5ExprPhrase *pFVar2;
  Fts5Index *p_00;
  char *pToken;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  int rc;
  int bHit;
  Fts5ExprTerm *p;
  Fts5ExprTerm *pTerm;
  int j;
  Fts5ExprPhrase *pPhrase;
  int i;
  Fts5ExprNearset *pNear;
  Fts5ExprNode *pNode_local;
  Fts5Expr *pExpr_local;
  
  pFVar1 = pNode->pNear;
  pPhrase._4_4_ = 0;
  while( true ) {
    if (pFVar1->nPhrase <= pPhrase._4_4_) {
      pNode->bEof = 0;
      return 0;
    }
    pFVar2 = pFVar1->apPhrase[pPhrase._4_4_];
    if (pFVar2->nTerm == 0) break;
    for (pTerm._4_4_ = 0; pTerm._4_4_ < pFVar2->nTerm; pTerm._4_4_ = pTerm._4_4_ + 1) {
      bVar3 = false;
      for (_rc = pFVar2->aTerm + pTerm._4_4_; _rc != (Fts5ExprTerm *)0x0; _rc = _rc->pSynonym) {
        if (_rc->pIter != (Fts5IndexIter *)0x0) {
          sqlite3Fts5IterClose(_rc->pIter);
          _rc->pIter = (Fts5IndexIter *)0x0;
        }
        p_00 = pExpr->pIndex;
        pToken = _rc->zTerm;
        sVar6 = strlen(_rc->zTerm);
        uVar4 = 0;
        if (pExpr->bDesc != 0) {
          uVar4 = 2;
        }
        iVar5 = sqlite3Fts5IndexQuery
                          (p_00,pToken,(int)sVar6,pFVar2->aTerm[pTerm._4_4_].bPrefix != '\0' | uVar4
                           ,pFVar1->pColset,&_rc->pIter);
        if (iVar5 != 0) {
          return iVar5;
        }
        if (_rc->pIter->bEof == '\0') {
          bVar3 = true;
        }
      }
      if (!bVar3) {
        pNode->bEof = 1;
        return 0;
      }
    }
    pPhrase._4_4_ = pPhrase._4_4_ + 1;
  }
  pNode->bEof = 1;
  return 0;
}

Assistant:

static int fts5ExprNearInitAll(
  Fts5Expr *pExpr,
  Fts5ExprNode *pNode
){
  Fts5ExprNearset *pNear = pNode->pNear;
  int i;

  assert( pNode->bNomatch==0 );
  for(i=0; i<pNear->nPhrase; i++){
    Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
    if( pPhrase->nTerm==0 ){
      pNode->bEof = 1;
      return SQLITE_OK;
    }else{
      int j;
      for(j=0; j<pPhrase->nTerm; j++){
        Fts5ExprTerm *pTerm = &pPhrase->aTerm[j];
        Fts5ExprTerm *p;
        int bHit = 0;

        for(p=pTerm; p; p=p->pSynonym){
          int rc;
          if( p->pIter ){
            sqlite3Fts5IterClose(p->pIter);
            p->pIter = 0;
          }
          rc = sqlite3Fts5IndexQuery(
              pExpr->pIndex, p->zTerm, (int)strlen(p->zTerm),
              (pTerm->bPrefix ? FTS5INDEX_QUERY_PREFIX : 0) |
              (pExpr->bDesc ? FTS5INDEX_QUERY_DESC : 0),
              pNear->pColset,
              &p->pIter
          );
          assert( (rc==SQLITE_OK)==(p->pIter!=0) );
          if( rc!=SQLITE_OK ) return rc;
          if( 0==sqlite3Fts5IterEof(p->pIter) ){
            bHit = 1;
          }
        }

        if( bHit==0 ){
          pNode->bEof = 1;
          return SQLITE_OK;
        }
      }
    }
  }

  pNode->bEof = 0;
  return SQLITE_OK;
}